

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

void __thiscall glslang::TVariable::TVariable(TVariable *this,TVariable *copyOf)

{
  TType *copyOf_00;
  TType *pTVar1;
  TConstUnionVector *pTVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TConstUnionArray newArray;
  TConstUnionArray local_40;
  
  TSymbol::TSymbol(&this->super_TSymbol,&copyOf->super_TSymbol);
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_00af61e0;
  TType::TType(&this->type,EbtVoid,EvqTemporary,1,0,0,false);
  (this->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00af64b8;
  (this->constArray).unionArray = (TConstUnionVector *)0x0;
  copyOf_00 = &copyOf->type;
  TType::deepCopy(&this->type,copyOf_00);
  this->userType = copyOf->userType;
  (this->super_TSymbol).extensions = (TExtensionList *)0x0;
  this->constSubtree = (TIntermTyped *)0x0;
  this->memberExtensions = (TVector<glslang::TVector<const_char_*>_> *)0x0;
  iVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])(copyOf);
  if (0 < iVar3) {
    uVar4 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])(copyOf);
    iVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x12])(copyOf);
    (*(this->super_TSymbol)._vptr_TSymbol[0x10])(this,(ulong)uVar4,CONCAT44(extraout_var,iVar3));
  }
  iVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x1f])(copyOf);
  if ((char)iVar3 != '\0') {
    iVar3 = (*copyOf_00->_vptr_TType[0x25])(copyOf_00);
    if ((char)iVar3 != '\0') {
      uVar4 = 0;
      do {
        pTVar1 = (copyOf->type).field_13.referentType;
        if ((int)((ulong)((long)(pTVar1->qualifier).semanticName - *(long *)&pTVar1->field_0x8) >> 5
                 ) <= (int)uVar4) goto LAB_003de64a;
        iVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])(copyOf,(ulong)uVar4);
        if (0 < iVar3) {
          uVar5 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])(copyOf,(ulong)uVar4);
          iVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x21])(copyOf,(ulong)uVar4);
          (*(this->super_TSymbol)._vptr_TSymbol[0x1e])
                    (this,(ulong)uVar4,(ulong)uVar5,CONCAT44(extraout_var_00,iVar3));
        }
        uVar4 = uVar4 + 1;
        iVar3 = (*copyOf_00->_vptr_TType[0x25])(copyOf_00);
      } while ((char)iVar3 != '\0');
    }
    __assert_fail("isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
  }
LAB_003de64a:
  pTVar2 = (copyOf->constArray).unionArray;
  if (pTVar2 != (TConstUnionVector *)0x0) {
    if ((byte)(copyOf->type).field_0x8 - 0xf < 2) {
      __assert_fail("! copyOf.type.isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                    ,0x189,"glslang::TVariable::TVariable(const TVariable &)");
    }
    TConstUnionArray::TConstUnionArray
              (&local_40,&copyOf->constArray,0,
               (int)((ulong)((long)(pTVar2->
                                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ).
                                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar2->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
    (this->constArray).unionArray = local_40.unionArray;
  }
  return;
}

Assistant:

TVariable::TVariable(const TVariable& copyOf) : TSymbol(copyOf)
{
    type.deepCopy(copyOf.type);
    userType = copyOf.userType;

    // we don't support specialization-constant subtrees in cloned tables, only extensions
    constSubtree = nullptr;
    extensions = nullptr;
    memberExtensions = nullptr;
    if (copyOf.getNumExtensions() > 0)
        setExtensions(copyOf.getNumExtensions(), copyOf.getExtensions());
    if (copyOf.hasMemberExtensions()) {
        for (int m = 0; m < (int)copyOf.type.getStruct()->size(); ++m) {
            if (copyOf.getNumMemberExtensions(m) > 0)
                setMemberExtensions(m, copyOf.getNumMemberExtensions(m), copyOf.getMemberExtensions(m));
        }
    }

    if (! copyOf.constArray.empty()) {
        assert(! copyOf.type.isStruct());
        TConstUnionArray newArray(copyOf.constArray, 0, copyOf.constArray.size());
        constArray = newArray;
    }
}